

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumpfile.cc
# Opt level: O3

void __thiscall
leveldb::anon_unknown_11::CorruptionReporter::Corruption
          (CorruptionReporter *this,size_t bytes,Status *status)

{
  string r;
  void *local_70;
  string local_68;
  string local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"corruption: ","");
  AppendNumberTo(&local_68,bytes);
  std::__cxx11::string::append((char *)&local_68);
  Status::ToString_abi_cxx11_(&local_48,status);
  std::__cxx11::string::_M_append
            ((char *)&local_68,
             CONCAT44(local_48._M_dataplus._M_p._4_4_,local_48._M_dataplus._M_p._0_4_));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_48._M_dataplus._M_p._4_4_,local_48._M_dataplus._M_p._0_4_) !=
      &local_48.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_48._M_dataplus._M_p._4_4_,local_48._M_dataplus._M_p._0_4_));
  }
  std::__cxx11::string::push_back((char)&local_68);
  local_48._M_dataplus._M_p._0_4_ = local_68._M_dataplus._M_p._0_4_;
  local_48._M_dataplus._M_p._4_4_ = local_68._M_dataplus._M_p._4_4_;
  local_48._M_string_length._0_4_ = (undefined4)local_68._M_string_length;
  local_48._M_string_length._4_4_ = local_68._M_string_length._4_4_;
  (*this->dst_->_vptr_WritableFile[2])(&local_70);
  if (local_70 != (void *)0x0) {
    operator_delete__(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Corruption(size_t bytes, const Status& status) override {
    std::string r = "corruption: ";
    AppendNumberTo(&r, bytes);
    r += " bytes; ";
    r += status.ToString();
    r.push_back('\n');
    dst_->Append(r);
  }